

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O1

shared_ptr<cppnet::Timer> cppnet::MakeTimer1Min(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  element_type *in_RDI;
  shared_ptr<cppnet::Timer> sVar3;
  shared_ptr<cppnet::TimerContainer> timer;
  shared_ptr<cppnet::TimerContainer> sec_sub;
  undefined1 local_69;
  element_type local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  TIME_UNIT local_58 [2];
  shared_ptr<cppnet::TimerContainer> local_50;
  _func_int **local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_68._vptr_Timer = (_func_int **)0x0;
  local_58[1] = 1;
  local_58[0] = TU_SECOND;
  local_50.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cppnet::TimerContainer,std::allocator<cppnet::TimerContainer>,decltype(nullptr),cppnet::TIME_UNIT,cppnet::TIME_UNIT>
            (&local_50.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(TimerContainer **)&local_50,
             (allocator<cppnet::TimerContainer> *)&local_69,&local_68._vptr_Timer,local_58 + 1,
             local_58);
  local_58[1] = 1000;
  local_58[0] = TU_MINUTE;
  local_68._vptr_Timer = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cppnet::TimerContainer,std::allocator<cppnet::TimerContainer>,std::shared_ptr<cppnet::TimerContainer>&,cppnet::TIME_UNIT,cppnet::TIME_UNIT>
            (&local_60,(TimerContainer **)&local_68,(allocator<cppnet::TimerContainer> *)&local_69,
             &local_50,local_58 + 1,local_58);
  local_40 = local_68._vptr_Timer;
  local_38._M_pi = local_60._M_pi;
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
    }
  }
  ((local_50.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _root_timer).super___weak_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_68._vptr_Timer;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&((local_50.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_root_timer).
              super___weak_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_38);
  _Var2._M_pi = extraout_RDX;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  _Var1._M_pi = local_60._M_pi;
  in_RDI->_vptr_Timer = local_68._vptr_Timer;
  in_RDI[1]._vptr_Timer = (_func_int **)0x0;
  local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  in_RDI[1]._vptr_Timer = (_func_int **)_Var1._M_pi;
  if (local_50.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_01;
  }
  sVar3.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<cppnet::Timer>)
         sVar3.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Timer> MakeTimer1Min() {
    auto sec_sub = std::make_shared<TimerContainer>(nullptr, TU_MILLISECOND, TU_SECOND);
    auto timer = std::make_shared<TimerContainer>(sec_sub, TU_SECOND, TU_MINUTE);
    sec_sub->SetRootTimer(timer);
    return timer;
}